

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

Norm * __thiscall
icu_63::Normalizer2DataBuilder::checkNormForMapping(Normalizer2DataBuilder *this,Norm *p,UChar32 c)

{
  uint uVar1;
  UnicodeString *pUVar2;
  uint uVar3;
  undefined4 in_register_00000014;
  
  if (p != (Norm *)0x0) {
    if (p->mappingType != NONE) {
      if (this->overrideHandling == OVERRIDE_PREVIOUS) {
        uVar3 = p->mappingPhase;
        uVar1 = uVar3;
        if (uVar3 == this->phase) goto LAB_001dcd20;
      }
      else if (this->overrideHandling == OVERRIDE_NONE) {
        uVar3 = this->phase;
        uVar1 = p->mappingPhase;
LAB_001dcd20:
        fprintf(_stderr,
                "error in gennorm2 phase %d: not permitted to override mapping for U+%04lX from phase %d\n"
                ,(ulong)uVar3,(long)c,(ulong)uVar1);
        exit(3);
      }
      pUVar2 = p->mapping;
      if (pUVar2 != (UnicodeString *)0x0) {
        (*(pUVar2->super_Replaceable).super_UObject._vptr_UObject[1])
                  (pUVar2,p,CONCAT44(in_register_00000014,c));
      }
      p->mapping = (UnicodeString *)0x0;
    }
    p->mappingPhase = this->phase;
  }
  return p;
}

Assistant:

Norm *Normalizer2DataBuilder::checkNormForMapping(Norm *p, UChar32 c) {
    if(p!=NULL) {
        if(p->mappingType!=Norm::NONE) {
            if( overrideHandling==OVERRIDE_NONE ||
                (overrideHandling==OVERRIDE_PREVIOUS && p->mappingPhase==phase)
            ) {
                fprintf(stderr,
                        "error in gennorm2 phase %d: "
                        "not permitted to override mapping for U+%04lX from phase %d\n",
                        (int)phase, (long)c, (int)p->mappingPhase);
                exit(U_INVALID_FORMAT_ERROR);
            }
            delete p->mapping;
            p->mapping=NULL;
        }
        p->mappingPhase=phase;
    }
    return p;
}